

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  long lVar51;
  long lVar52;
  undefined4 uVar53;
  long lVar54;
  ulong uVar55;
  size_t *psVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar79;
  undefined1 auVar77 [32];
  undefined1 auVar80 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar81;
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  size_t local_2f0;
  size_t local_2d0;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar78 [64];
  undefined1 auVar82 [64];
  
  aVar74.m128[2] = INFINITY;
  aVar74._0_8_ = 0x7f8000007f800000;
  aVar74.m128[3] = INFINITY;
  auVar78 = ZEXT1664((undefined1  [16])aVar74);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar74;
  aVar81.m128[2] = -INFINITY;
  aVar81._0_8_ = 0xff800000ff800000;
  aVar81.m128[3] = -INFINITY;
  auVar82 = ZEXT1664((undefined1  [16])aVar81);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar74;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar81;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar55 = r->_begin;
  local_2f0 = __return_storage_ptr__->end;
  aVar89 = aVar74;
  aVar69 = aVar81;
  if (uVar55 < r->_end) {
    auVar72._8_4_ = 0x7fffffff;
    auVar72._0_8_ = 0x7fffffff7fffffff;
    auVar72._12_4_ = 0x7fffffff;
    auVar73._8_4_ = 0x5dccb9a2;
    auVar73._0_8_ = 0x5dccb9a25dccb9a2;
    auVar73._12_4_ = 0x5dccb9a2;
    auVar80._8_4_ = 0xddccb9a2;
    auVar80._0_8_ = 0xddccb9a2ddccb9a2;
    auVar80._12_4_ = 0xddccb9a2;
    auVar92 = ZEXT1664((undefined1  [16])aVar74);
    auVar71 = ZEXT1664((undefined1  [16])aVar81);
    local_2d0 = k;
    do {
      uVar6 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar55);
      uVar57 = (ulong)(uVar6 + 3);
      pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar57 < (pBVar7->super_RawBufferView).num) {
        uVar59 = (ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        psVar56 = &(pBVar7->super_RawBufferView).stride;
        bVar60 = false;
        uVar58 = 0;
        do {
          pcVar8 = ((RawBufferView *)(psVar56 + -2))->ptr_ofs;
          sVar9 = *psVar56;
          lVar54 = sVar9 * uVar6;
          lVar52 = sVar9 * (uVar6 + 1);
          lVar51 = sVar9 * (uVar6 + 2);
          auVar63 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar54 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar52 + 0xc)),0x10);
          auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(pcVar8 + lVar51 + 0xc)),0x20);
          auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(pcVar8 + sVar9 * uVar57 + 0xc)),0x30);
          auVar63 = vandps_avx(auVar63,auVar72);
          auVar63 = vcmpps_avx(auVar63,auVar73,5);
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
LAB_01315fbd:
            if (!bVar60) goto LAB_013162b6;
            break;
          }
          auVar63 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + lVar54),auVar80,6);
          auVar62 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + lVar54),auVar73,1);
          auVar63 = vandps_avx(auVar63,auVar62);
          uVar53 = vmovmskps_avx(auVar63);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01315fbd;
          auVar63 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + lVar52),auVar80,6);
          auVar62 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + lVar52),auVar73,1);
          auVar63 = vandps_avx(auVar63,auVar62);
          uVar53 = vmovmskps_avx(auVar63);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01315fbd;
          auVar63 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + lVar51),auVar80,6);
          auVar62 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + lVar51),auVar73,1);
          auVar63 = vandps_avx(auVar63,auVar62);
          uVar53 = vmovmskps_avx(auVar63);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01315fbd;
          auVar63 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + sVar9 * uVar57),auVar80,6);
          auVar62 = vcmpps_avx(*(undefined1 (*) [16])(pcVar8 + sVar9 * uVar57),auVar73,1);
          auVar63 = vandps_avx(auVar63,auVar62);
          uVar53 = vmovmskps_avx(auVar63);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01315fbd;
          bVar60 = uVar59 <= uVar58;
          uVar58 = uVar58 + 1;
          psVar56 = psVar56 + 7;
        } while (uVar59 + 1 != uVar58);
        pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar7->super_RawBufferView).stride;
        lVar51 = uVar6 * sVar9;
        auVar63 = *(undefined1 (*) [16])(pcVar8 + lVar51);
        lVar54 = (uVar6 + 1) * sVar9;
        auVar62 = *(undefined1 (*) [16])(pcVar8 + lVar54);
        lVar52 = (uVar6 + 2) * sVar9;
        auVar5 = *(undefined1 (*) [16])(pcVar8 + lVar52);
        auVar85 = *(undefined1 (*) [16])(pcVar8 + uVar57 * sVar9);
        fVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                maxRadiusScale;
        fVar12 = fVar4 * *(float *)(pcVar8 + lVar51 + 0xc);
        fVar13 = fVar4 * *(float *)(pcVar8 + lVar54 + 0xc);
        fVar14 = fVar4 * *(float *)(pcVar8 + lVar52 + 0xc);
        fVar4 = fVar4 * *(float *)(pcVar8 + uVar57 * sVar9 + 0xc);
        uVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                tessellationRate;
        uVar57 = (ulong)uVar6;
        auVar75 = auVar78._0_16_;
        auVar93 = ZEXT416((uint)fVar14);
        if (uVar57 == 4) {
          auVar17 = vshufps_avx(auVar85,auVar85,0);
          auVar18 = vshufps_avx(auVar85,auVar85,0x55);
          auVar65 = vshufps_avx(auVar85,auVar85,0xaa);
          auVar19 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
          auVar61 = vshufps_avx(auVar5,auVar5,0);
          auVar76 = vshufps_avx(auVar5,auVar5,0x55);
          auVar85 = vinsertps_avx(auVar5,ZEXT416((uint)fVar14),0x30);
          auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
          auVar20 = vshufps_avx(ZEXT416((uint)fVar14),auVar93,0);
          auVar93 = vshufps_avx(auVar62,auVar62,0);
          auVar21 = vshufps_avx(auVar62,auVar62,0x55);
          auVar62 = vshufps_avx(auVar62,auVar62,0xaa);
          auVar22 = vshufps_avx(auVar63,auVar63,0);
          auVar23 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
          auVar24 = vshufps_avx(auVar63,auVar63,0x55);
          auVar63 = vshufps_avx(auVar63,auVar63,0xaa);
          auVar25 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
          auVar68._0_4_ =
               auVar22._0_4_ * (float)catmullrom_basis0._272_4_ +
               auVar93._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar61._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar17._0_4_ * (float)catmullrom_basis0._3740_4_;
          auVar68._4_4_ =
               auVar22._4_4_ * (float)catmullrom_basis0._276_4_ +
               auVar93._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar61._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar17._4_4_ * (float)catmullrom_basis0._3744_4_;
          auVar68._8_4_ =
               auVar22._8_4_ * (float)catmullrom_basis0._280_4_ +
               auVar93._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar61._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar17._8_4_ * (float)catmullrom_basis0._3748_4_;
          auVar68._12_4_ =
               auVar22._12_4_ * (float)catmullrom_basis0._284_4_ +
               auVar93._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar61._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar17._12_4_ * (float)catmullrom_basis0._3752_4_;
          auVar61._0_4_ =
               auVar24._0_4_ * (float)catmullrom_basis0._272_4_ +
               auVar21._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar76._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar18._0_4_ * (float)catmullrom_basis0._3740_4_;
          auVar61._4_4_ =
               auVar24._4_4_ * (float)catmullrom_basis0._276_4_ +
               auVar21._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar76._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar18._4_4_ * (float)catmullrom_basis0._3744_4_;
          auVar61._8_4_ =
               auVar24._8_4_ * (float)catmullrom_basis0._280_4_ +
               auVar21._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar76._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar18._8_4_ * (float)catmullrom_basis0._3748_4_;
          auVar61._12_4_ =
               auVar24._12_4_ * (float)catmullrom_basis0._284_4_ +
               auVar21._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar76._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar18._12_4_ * (float)catmullrom_basis0._3752_4_;
          auVar76._0_4_ =
               auVar62._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar5._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar65._0_4_ * (float)catmullrom_basis0._3740_4_ +
               auVar63._0_4_ * (float)catmullrom_basis0._272_4_;
          auVar76._4_4_ =
               auVar62._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar5._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar65._4_4_ * (float)catmullrom_basis0._3744_4_ +
               auVar63._4_4_ * (float)catmullrom_basis0._276_4_;
          auVar76._8_4_ =
               auVar62._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar5._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar65._8_4_ * (float)catmullrom_basis0._3748_4_ +
               auVar63._8_4_ * (float)catmullrom_basis0._280_4_;
          auVar76._12_4_ =
               auVar62._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar5._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar65._12_4_ * (float)catmullrom_basis0._3752_4_ +
               auVar63._12_4_ * (float)catmullrom_basis0._284_4_;
          auVar65._0_4_ =
               auVar25._0_4_ * (float)catmullrom_basis0._272_4_ +
               auVar23._0_4_ * (float)catmullrom_basis0._1428_4_ +
               auVar20._0_4_ * (float)catmullrom_basis0._2584_4_ +
               auVar19._0_4_ * (float)catmullrom_basis0._3740_4_;
          auVar65._4_4_ =
               auVar25._4_4_ * (float)catmullrom_basis0._276_4_ +
               auVar23._4_4_ * (float)catmullrom_basis0._1432_4_ +
               auVar20._4_4_ * (float)catmullrom_basis0._2588_4_ +
               auVar19._4_4_ * (float)catmullrom_basis0._3744_4_;
          auVar65._8_4_ =
               auVar25._8_4_ * (float)catmullrom_basis0._280_4_ +
               auVar23._8_4_ * (float)catmullrom_basis0._1436_4_ +
               auVar20._8_4_ * (float)catmullrom_basis0._2592_4_ +
               auVar19._8_4_ * (float)catmullrom_basis0._3748_4_;
          auVar65._12_4_ =
               auVar25._12_4_ * (float)catmullrom_basis0._284_4_ +
               auVar23._12_4_ * (float)catmullrom_basis0._1440_4_ +
               auVar20._12_4_ * (float)catmullrom_basis0._2596_4_ +
               auVar19._12_4_ * (float)catmullrom_basis0._3752_4_;
          auVar93 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar63 = vminps_avx(auVar93,auVar68);
          auVar62 = vshufpd_avx(auVar63,auVar63,1);
          auVar63 = vminps_avx(auVar62,auVar63);
          auVar17 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar62 = vminps_avx(auVar17,auVar61);
          auVar5 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vminps_avx(auVar5,auVar62);
          auVar63 = vinsertps_avx(auVar63,auVar62,0x1c);
          auVar18 = vshufps_avx(auVar76,auVar76,0xb1);
          auVar62 = vminps_avx(auVar18,auVar76);
          auVar5 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vminps_avx(auVar5,auVar62);
          auVar62 = vinsertps_avx(auVar63,auVar62,0x20);
          auVar63 = vmaxps_avx(auVar93,auVar68);
          auVar5 = vshufpd_avx(auVar63,auVar63,1);
          auVar63 = vmaxps_avx(auVar5,auVar63);
          auVar5 = vmaxps_avx(auVar17,auVar61);
          auVar93 = vshufpd_avx(auVar5,auVar5,1);
          auVar5 = vmaxps_avx(auVar93,auVar5);
          auVar63 = vinsertps_avx(auVar63,auVar5,0x1c);
          auVar5 = vmaxps_avx(auVar18,auVar76);
          auVar93 = vshufpd_avx(auVar5,auVar5,1);
          auVar5 = vmaxps_avx(auVar93,auVar5);
          auVar5 = vinsertps_avx(auVar63,auVar5,0x20);
          auVar63 = vandps_avx(auVar65,auVar72);
          auVar93 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar63 = vmaxps_avx(auVar93,auVar63);
          auVar93 = vshufps_avx(auVar63,auVar63,0);
          auVar63 = vshufps_avx(auVar63,auVar63,0xaa);
          auVar93 = vmaxps_avx(auVar63,auVar93);
          auVar17 = vminps_avx(auVar62,auVar85);
          auVar62 = vmaxps_avx(auVar5,auVar85);
          auVar63 = vandps_avx(auVar20,auVar72);
          auVar5 = vmaxps_avx(auVar93,auVar63);
          auVar63 = vsubps_avx(auVar17,auVar5);
          auVar85._0_4_ = auVar62._0_4_ + auVar5._0_4_;
          auVar85._4_4_ = auVar62._4_4_ + auVar5._4_4_;
          auVar85._8_4_ = auVar62._8_4_ + auVar5._8_4_;
          auVar85._12_4_ = auVar62._12_4_ + auVar5._12_4_;
        }
        else {
          if ((int)uVar6 < 0) {
            auVar67 = ZEXT832(0);
            auVar87._8_4_ = 0xff800000;
            auVar87._0_8_ = 0xff800000ff800000;
            auVar87._12_4_ = 0xff800000;
            auVar87._16_4_ = 0xff800000;
            auVar87._20_4_ = 0xff800000;
            auVar87._24_4_ = 0xff800000;
            auVar87._28_4_ = 0xff800000;
            auVar90._8_4_ = 0x7f800000;
            auVar90._0_8_ = 0x7f8000007f800000;
            auVar90._12_4_ = 0x7f800000;
            auVar90._16_4_ = 0x7f800000;
            auVar90._20_4_ = 0x7f800000;
            auVar90._24_4_ = 0x7f800000;
            auVar90._28_4_ = 0x7f800000;
            auVar94 = auVar90;
            auVar88 = auVar87;
            auVar91 = auVar90;
            auVar86 = auVar87;
          }
          else {
            auVar17 = vpshufd_avx(ZEXT416(uVar6),0);
            auVar18 = vshufps_avx(auVar63,auVar63,0);
            auVar65 = vshufps_avx(auVar63,auVar63,0x55);
            auVar19 = vshufps_avx(auVar63,auVar63,0xaa);
            auVar61 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
            auVar76 = vshufps_avx(auVar62,auVar62,0);
            auVar20 = vshufps_avx(auVar62,auVar62,0x55);
            auVar62 = vshufps_avx(auVar62,auVar62,0xaa);
            auVar21 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
            auVar22 = vshufps_avx(auVar5,auVar5,0);
            auVar23 = vshufps_avx(auVar5,auVar5,0x55);
            auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            auVar24 = vshufps_avx(auVar85,auVar85,0);
            auVar25 = vshufps_avx(auVar85,auVar85,0x55);
            auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
            auVar68 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
            lVar51 = uVar57 * 0x44;
            uVar58 = 0;
            auVar83 = ZEXT864(0);
            auVar94._8_4_ = 0x7f800000;
            auVar94._0_8_ = 0x7f8000007f800000;
            auVar94._12_4_ = 0x7f800000;
            auVar94._16_4_ = 0x7f800000;
            auVar94._20_4_ = 0x7f800000;
            auVar94._24_4_ = 0x7f800000;
            auVar94._28_4_ = 0x7f800000;
            auVar88._8_4_ = 0xff800000;
            auVar88._0_8_ = 0xff800000ff800000;
            auVar88._12_4_ = 0xff800000;
            auVar88._16_4_ = 0xff800000;
            auVar88._20_4_ = 0xff800000;
            auVar88._24_4_ = 0xff800000;
            auVar88._28_4_ = 0xff800000;
            auVar63 = vpmovsxbd_avx(ZEXT416(0x7060504));
            auVar87 = auVar88;
            auVar90 = auVar94;
            auVar91 = auVar94;
            auVar86 = auVar88;
            do {
              auVar16 = vpshufd_avx(ZEXT416((uint)uVar58),0);
              auVar15 = vpor_avx(auVar16,_DAT_01ff0cf0);
              auVar16 = vpor_avx(auVar63,auVar16);
              auVar63 = vpcmpgtd_avx(auVar15,auVar17);
              auVar15 = vpcmpgtd_avx(auVar16,auVar17);
              auVar84._16_16_ = auVar15;
              auVar84._0_16_ = auVar63;
              pfVar1 = (float *)(lVar51 + 0x2230c74 + uVar58 * 4);
              fVar4 = *pfVar1;
              fVar12 = pfVar1[1];
              fVar13 = pfVar1[2];
              fVar14 = pfVar1[3];
              fVar26 = pfVar1[4];
              fVar27 = pfVar1[5];
              fVar28 = pfVar1[6];
              pfVar2 = (float *)(lVar51 + 0x22310f8 + uVar58 * 4);
              fVar29 = *pfVar2;
              fVar30 = pfVar2[1];
              fVar31 = pfVar2[2];
              fVar32 = pfVar2[3];
              fVar33 = pfVar2[4];
              fVar34 = pfVar2[5];
              fVar35 = pfVar2[6];
              local_1f8 = auVar24._0_4_;
              fStack_1f4 = auVar24._4_4_;
              fStack_1f0 = auVar24._8_4_;
              fStack_1ec = auVar24._12_4_;
              local_218 = auVar25._0_4_;
              fStack_214 = auVar25._4_4_;
              fStack_210 = auVar25._8_4_;
              fStack_20c = auVar25._12_4_;
              local_238 = auVar85._0_4_;
              fStack_234 = auVar85._4_4_;
              fStack_230 = auVar85._8_4_;
              fStack_22c = auVar85._12_4_;
              local_178 = auVar22._0_4_;
              fStack_174 = auVar22._4_4_;
              fStack_170 = auVar22._8_4_;
              fStack_16c = auVar22._12_4_;
              local_198 = auVar23._0_4_;
              fStack_194 = auVar23._4_4_;
              fStack_190 = auVar23._8_4_;
              fStack_18c = auVar23._12_4_;
              fVar79 = auVar78._28_4_ + 0.0;
              local_1b8 = auVar5._0_4_;
              fStack_1b4 = auVar5._4_4_;
              fStack_1b0 = auVar5._8_4_;
              fStack_1ac = auVar5._12_4_;
              pfVar3 = (float *)(lVar51 + 0x22307f0 + uVar58 * 4);
              fVar36 = *pfVar3;
              fVar37 = pfVar3[1];
              fVar38 = pfVar3[2];
              fVar39 = pfVar3[3];
              fVar40 = pfVar3[4];
              fVar41 = pfVar3[5];
              fVar42 = pfVar3[6];
              fVar43 = pfVar3[7];
              local_258 = auVar68._0_4_;
              fStack_254 = auVar68._4_4_;
              fStack_250 = auVar68._8_4_;
              fStack_24c = auVar68._12_4_;
              local_1d8 = auVar93._0_4_;
              fStack_1d4 = auVar93._4_4_;
              fStack_1d0 = auVar93._8_4_;
              fStack_1cc = auVar93._12_4_;
              local_f8 = auVar76._0_4_;
              fStack_f4 = auVar76._4_4_;
              fStack_f0 = auVar76._8_4_;
              fStack_ec = auVar76._12_4_;
              local_118 = auVar20._0_4_;
              fStack_114 = auVar20._4_4_;
              fStack_110 = auVar20._8_4_;
              fStack_10c = auVar20._12_4_;
              local_138 = auVar62._0_4_;
              fStack_134 = auVar62._4_4_;
              fStack_130 = auVar62._8_4_;
              fStack_12c = auVar62._12_4_;
              pfVar3 = (float *)(catmullrom_basis0 + uVar58 * 4 + lVar51);
              fVar44 = *pfVar3;
              fVar45 = pfVar3[1];
              fVar46 = pfVar3[2];
              fVar47 = pfVar3[3];
              fVar48 = pfVar3[4];
              fVar49 = pfVar3[5];
              fVar50 = pfVar3[6];
              local_158 = auVar21._0_4_;
              fStack_154 = auVar21._4_4_;
              fStack_150 = auVar21._8_4_;
              fStack_14c = auVar21._12_4_;
              local_78 = auVar18._0_4_;
              fStack_74 = auVar18._4_4_;
              fStack_70 = auVar18._8_4_;
              fStack_6c = auVar18._12_4_;
              auVar66._0_4_ =
                   fVar44 * local_78 + fVar36 * local_f8 + fVar4 * local_178 + fVar29 * local_1f8;
              auVar66._4_4_ =
                   fVar45 * fStack_74 +
                   fVar37 * fStack_f4 + fVar12 * fStack_174 + fVar30 * fStack_1f4;
              auVar66._8_4_ =
                   fVar46 * fStack_70 +
                   fVar38 * fStack_f0 + fVar13 * fStack_170 + fVar31 * fStack_1f0;
              auVar66._12_4_ =
                   fVar47 * fStack_6c +
                   fVar39 * fStack_ec + fVar14 * fStack_16c + fVar32 * fStack_1ec;
              auVar66._16_4_ =
                   fVar48 * local_78 + fVar40 * local_f8 + fVar26 * local_178 + fVar33 * local_1f8;
              auVar66._20_4_ =
                   fVar49 * fStack_74 +
                   fVar41 * fStack_f4 + fVar27 * fStack_174 + fVar34 * fStack_1f4;
              auVar66._24_4_ =
                   fVar50 * fStack_70 +
                   fVar42 * fStack_f0 + fVar28 * fStack_170 + fVar35 * fStack_1f0;
              auVar66._28_4_ = fVar43 + pfVar2[7] + 0.0;
              local_98 = auVar65._0_4_;
              fStack_94 = auVar65._4_4_;
              fStack_90 = auVar65._8_4_;
              fStack_8c = auVar65._12_4_;
              auVar70._0_4_ =
                   fVar44 * local_98 + fVar36 * local_118 + fVar4 * local_198 + fVar29 * local_218;
              auVar70._4_4_ =
                   fVar45 * fStack_94 +
                   fVar37 * fStack_114 + fVar12 * fStack_194 + fVar30 * fStack_214;
              auVar70._8_4_ =
                   fVar46 * fStack_90 +
                   fVar38 * fStack_110 + fVar13 * fStack_190 + fVar31 * fStack_210;
              auVar70._12_4_ =
                   fVar47 * fStack_8c +
                   fVar39 * fStack_10c + fVar14 * fStack_18c + fVar32 * fStack_20c;
              auVar70._16_4_ =
                   fVar48 * local_98 + fVar40 * local_118 + fVar26 * local_198 + fVar33 * local_218;
              auVar70._20_4_ =
                   fVar49 * fStack_94 +
                   fVar41 * fStack_114 + fVar27 * fStack_194 + fVar34 * fStack_214;
              auVar70._24_4_ =
                   fVar50 * fStack_90 +
                   fVar42 * fStack_110 + fVar28 * fStack_190 + fVar35 * fStack_210;
              auVar70._28_4_ = fVar43 + fVar79 + 0.0;
              auVar67 = vminps_avx(auVar90,auVar66);
              auVar90 = vblendvps_avx(auVar67,auVar90,auVar84);
              local_b8 = auVar19._0_4_;
              fStack_b4 = auVar19._4_4_;
              fStack_b0 = auVar19._8_4_;
              fStack_ac = auVar19._12_4_;
              auVar77._0_4_ =
                   fVar44 * local_b8 + fVar36 * local_138 + fVar4 * local_1b8 + fVar29 * local_238;
              auVar77._4_4_ =
                   fVar45 * fStack_b4 +
                   fVar37 * fStack_134 + fVar12 * fStack_1b4 + fVar30 * fStack_234;
              auVar77._8_4_ =
                   fVar46 * fStack_b0 +
                   fVar38 * fStack_130 + fVar13 * fStack_1b0 + fVar31 * fStack_230;
              auVar77._12_4_ =
                   fVar47 * fStack_ac +
                   fVar39 * fStack_12c + fVar14 * fStack_1ac + fVar32 * fStack_22c;
              auVar77._16_4_ =
                   fVar48 * local_b8 + fVar40 * local_138 + fVar26 * local_1b8 + fVar33 * local_238;
              auVar77._20_4_ =
                   fVar49 * fStack_b4 +
                   fVar41 * fStack_134 + fVar27 * fStack_1b4 + fVar34 * fStack_234;
              auVar77._24_4_ =
                   fVar50 * fStack_b0 +
                   fVar42 * fStack_130 + fVar28 * fStack_1b0 + fVar35 * fStack_230;
              auVar77._28_4_ = auVar67._28_4_ + fVar79 + auVar83._28_4_ + 0.0;
              auVar78 = ZEXT3264(auVar77);
              auVar67 = vminps_avx(auVar94,auVar70);
              auVar94 = vblendvps_avx(auVar67,auVar94,auVar84);
              auVar67 = vminps_avx(auVar91,auVar77);
              auVar91 = vblendvps_avx(auVar67,auVar91,auVar84);
              local_d8 = auVar61._0_4_;
              fStack_d4 = auVar61._4_4_;
              fStack_d0 = auVar61._8_4_;
              fStack_cc = auVar61._12_4_;
              auVar64._0_4_ =
                   fVar44 * local_d8 + fVar36 * local_158 + fVar4 * local_1d8 + fVar29 * local_258;
              auVar64._4_4_ =
                   fVar45 * fStack_d4 +
                   fVar37 * fStack_154 + fVar12 * fStack_1d4 + fVar30 * fStack_254;
              auVar64._8_4_ =
                   fVar46 * fStack_d0 +
                   fVar38 * fStack_150 + fVar13 * fStack_1d0 + fVar31 * fStack_250;
              auVar64._12_4_ =
                   fVar47 * fStack_cc +
                   fVar39 * fStack_14c + fVar14 * fStack_1cc + fVar32 * fStack_24c;
              auVar64._16_4_ =
                   fVar48 * local_d8 + fVar40 * local_158 + fVar26 * local_1d8 + fVar33 * local_258;
              auVar64._20_4_ =
                   fVar49 * fStack_d4 +
                   fVar41 * fStack_154 + fVar27 * fStack_1d4 + fVar34 * fStack_254;
              auVar64._24_4_ =
                   fVar50 * fStack_d0 +
                   fVar42 * fStack_150 + fVar28 * fStack_1d0 + fVar35 * fStack_250;
              auVar64._28_4_ = pfVar3[7] + fVar43 + pfVar1[7] + pfVar2[7];
              auVar67 = vmaxps_avx(auVar87,auVar66);
              auVar87 = vblendvps_avx(auVar67,auVar87,auVar84);
              auVar67 = vmaxps_avx(auVar86,auVar70);
              auVar86 = vblendvps_avx(auVar67,auVar86,auVar84);
              auVar67 = vmaxps_avx(auVar88,auVar77);
              auVar88 = vblendvps_avx(auVar67,auVar88,auVar84);
              auVar67._8_4_ = 0x7fffffff;
              auVar67._0_8_ = 0x7fffffff7fffffff;
              auVar67._12_4_ = 0x7fffffff;
              auVar67._16_4_ = 0x7fffffff;
              auVar67._20_4_ = 0x7fffffff;
              auVar67._24_4_ = 0x7fffffff;
              auVar67._28_4_ = 0x7fffffff;
              auVar67 = vandps_avx(auVar64,auVar67);
              auVar67 = vmaxps_avx(auVar83._0_32_,auVar67);
              auVar67 = vblendvps_avx(auVar67,auVar83._0_32_,auVar84);
              auVar83 = ZEXT3264(auVar67);
              uVar58 = uVar58 + 8;
              auVar63 = _DAT_02020ea0;
            } while (uVar58 <= uVar57);
          }
          auVar64 = vshufps_avx(auVar90,auVar90,0xb1);
          auVar90 = vminps_avx(auVar90,auVar64);
          auVar64 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar64);
          auVar63 = vminps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar90 = vshufps_avx(auVar94,auVar94,0xb1);
          auVar90 = vminps_avx(auVar94,auVar90);
          auVar94 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar94);
          auVar62 = vminps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar62 = vunpcklps_avx(auVar63,auVar62);
          auVar90 = vshufps_avx(auVar91,auVar91,0xb1);
          auVar90 = vminps_avx(auVar91,auVar90);
          auVar94 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vminps_avx(auVar90,auVar94);
          auVar63 = vminps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar63 = vinsertps_avx(auVar62,auVar63,0x28);
          auVar90 = vshufps_avx(auVar87,auVar87,0xb1);
          auVar90 = vmaxps_avx(auVar87,auVar90);
          auVar94 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vmaxps_avx(auVar90,auVar94);
          auVar62 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar90 = vshufps_avx(auVar86,auVar86,0xb1);
          auVar90 = vmaxps_avx(auVar86,auVar90);
          auVar94 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vmaxps_avx(auVar90,auVar94);
          auVar5 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar5 = vunpcklps_avx(auVar62,auVar5);
          auVar90 = vshufps_avx(auVar88,auVar88,0xb1);
          auVar90 = vmaxps_avx(auVar88,auVar90);
          auVar94 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vmaxps_avx(auVar90,auVar94);
          auVar62 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar62 = vinsertps_avx(auVar5,auVar62,0x28);
          auVar90 = vshufps_avx(auVar67,auVar67,0xb1);
          auVar90 = vmaxps_avx(auVar67,auVar90);
          auVar94 = vshufpd_avx(auVar90,auVar90,5);
          auVar90 = vmaxps_avx(auVar90,auVar94);
          auVar5 = vmaxps_avx(auVar90._0_16_,auVar90._16_16_);
          auVar5 = vshufps_avx(auVar5,auVar5,0);
          auVar63 = vsubps_avx(auVar63,auVar5);
          auVar85._0_4_ = auVar62._0_4_ + auVar5._0_4_;
          auVar85._4_4_ = auVar62._4_4_ + auVar5._4_4_;
          auVar85._8_4_ = auVar62._8_4_ + auVar5._8_4_;
          auVar85._12_4_ = auVar62._12_4_ + auVar5._12_4_;
        }
        auVar62 = vandps_avx(auVar63,auVar72);
        auVar5 = vandps_avx(auVar85,auVar72);
        auVar62 = vmaxps_avx(auVar62,auVar5);
        auVar5 = vmovshdup_avx(auVar62);
        auVar5 = vmaxss_avx(auVar5,auVar62);
        auVar62 = vshufpd_avx(auVar62,auVar62,1);
        auVar62 = vmaxss_avx(auVar62,auVar5);
        auVar62 = ZEXT416((uint)(auVar62._0_4_ * 4.7683716e-07));
        auVar62 = vshufps_avx(auVar62,auVar62,0);
        auVar63 = vsubps_avx(auVar63,auVar62);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar63,ZEXT416(geomID),0x30);
        auVar63._0_4_ = auVar85._0_4_ + auVar62._0_4_;
        auVar63._4_4_ = auVar85._4_4_ + auVar62._4_4_;
        auVar63._8_4_ = auVar85._8_4_ + auVar62._8_4_;
        auVar63._12_4_ = auVar85._12_4_ + auVar62._12_4_;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar63,ZEXT416((uint)uVar55),0x30);
        auVar63 = vminps_avx(auVar75,(undefined1  [16])aVar10);
        auVar78 = ZEXT1664(auVar63);
        auVar63 = vmaxps_avx(auVar82._0_16_,(undefined1  [16])aVar11);
        auVar82 = ZEXT1664(auVar63);
        auVar62._0_4_ = aVar10.x + aVar11.x;
        auVar62._4_4_ = aVar10.y + aVar11.y;
        auVar62._8_4_ = aVar10.z + aVar11.z;
        auVar62._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
        auVar63 = vminps_avx(auVar92._0_16_,auVar62);
        auVar92 = ZEXT1664(auVar63);
        auVar63 = vmaxps_avx(auVar71._0_16_,auVar62);
        auVar71 = ZEXT1664(auVar63);
        local_2f0 = local_2f0 + 1;
        prims[local_2d0].upper.field_0.field_1 = aVar11;
        prims[local_2d0].lower.field_0.field_1 = aVar10;
        local_2d0 = local_2d0 + 1;
      }
LAB_013162b6:
      aVar69 = auVar71._0_16_;
      aVar89 = auVar92._0_16_;
      aVar81 = auVar82._0_16_;
      aVar74 = auVar78._0_16_;
      uVar55 = uVar55 + 1;
    } while (uVar55 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar74;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar89;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar69;
  __return_storage_ptr__->end = local_2f0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }